

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O0

word * If_DsdManGetFuncConfig(If_DsdMan_t *p,int iDsd)

{
  int iVar1;
  Vec_Wrd_t *p_00;
  int iVar2;
  word *local_20;
  int iDsd_local;
  If_DsdMan_t *p_local;
  
  if (p->vConfigs == (Vec_Wrd_t *)0x0) {
    local_20 = (word *)0x0;
  }
  else {
    p_00 = p->vConfigs;
    iVar1 = p->nConfigWords;
    iVar2 = Abc_Lit2Var(iDsd);
    local_20 = Vec_WrdEntryP(p_00,iVar1 * iVar2);
  }
  return local_20;
}

Assistant:

word * If_DsdManGetFuncConfig( If_DsdMan_t * p, int iDsd )
{
    return p->vConfigs ? Vec_WrdEntryP(p->vConfigs, p->nConfigWords * Abc_Lit2Var(iDsd)) : NULL;
}